

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

logical pnga_update3_ghosts(Integer g_a)

{
  short sVar1;
  short sVar2;
  int iVar3;
  Integer IVar4;
  logical lVar5;
  long lVar6;
  void *__ptr;
  long *__ptr_00;
  size_t sVar7;
  Integer IVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long in_RDI;
  int _d_15;
  int _i_21;
  int _ndim_19;
  int _i_20;
  int _itmp_7;
  int _offset_7;
  int _ndim_18;
  int _i_19;
  int _index_15 [7];
  int _ndim_17;
  int _i_18;
  int _itmp_6;
  int _ndim_16;
  int _i_17;
  int _index_14 [7];
  int _ndim_15;
  int _i_16;
  Integer _dimpos_7;
  Integer _dimstart_7;
  Integer _dim_7;
  Integer _index_13;
  Integer _d_14;
  Integer _nb_7;
  Integer _loc_7;
  Integer _dimpos_6;
  Integer _dimstart_6;
  Integer _dim_6;
  Integer _index_12;
  Integer _d_13;
  Integer _nb_6;
  Integer _loc_6;
  Integer _hi_3 [7];
  Integer _lo_3 [7];
  Integer _offset_6;
  Integer _last_3;
  Integer _factor_3;
  Integer _d_12;
  int _ndim_14;
  int _i_15;
  int _itmp_5;
  int _offset_5;
  int _ndim_13;
  int _i_14;
  int _index_11 [7];
  int _ndim_12;
  int _i_13;
  int _itmp_4;
  int _ndim_11;
  int _i_12;
  int _index_10 [7];
  int _ndim_10;
  int _i_11;
  Integer _dimpos_5;
  Integer _dimstart_5;
  Integer _dim_5;
  Integer _index_9;
  Integer _d_11;
  Integer _nb_5;
  Integer _loc_5;
  Integer _dimpos_4;
  Integer _dimstart_4;
  Integer _dim_4;
  Integer _index_8;
  Integer _d_10;
  Integer _nb_4;
  Integer _loc_4;
  Integer _hi_2 [7];
  Integer _lo_2 [7];
  Integer _offset_4;
  Integer _last_2;
  Integer _factor_2;
  Integer _d_9;
  char err_string_1 [256];
  char *str_1;
  int _l_1;
  int _d_8;
  int _d_7;
  int _i_10;
  int _ndim_9;
  int _i_9;
  int _itmp_3;
  int _offset_3;
  int _ndim_8;
  int _i_8;
  int _index_7 [7];
  int _ndim_7;
  int _i_7;
  int _itmp_2;
  int _ndim_6;
  int _i_6;
  int _index_6 [7];
  int _ndim_5;
  int _i_5;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_6;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_5;
  Integer _nb_2;
  Integer _loc_2;
  Integer _hi_1 [7];
  Integer _lo_1 [7];
  Integer _offset_2;
  Integer _last_1;
  Integer _factor_1;
  Integer _d_4;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_3;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_2;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d_1;
  char err_string [256];
  char *str;
  int _l;
  int _d;
  Integer *_ga_proclist;
  Integer *_ga_map;
  Integer p_handle;
  Integer me;
  char *ptr_rem;
  char *ptr_loc;
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer phi_rem [7];
  Integer plo_rem [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer plo_loc [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer dims [7];
  Integer width [7];
  Integer increment [7];
  Integer nwidth;
  Integer ndim;
  Integer size;
  Integer proc_rem;
  Integer handle;
  Integer np;
  Integer i;
  Integer idx;
  Integer *pIVar12;
  int iVar13;
  Integer *in_stack_fffffffffffff350;
  Integer *slo_rem_00;
  Integer *in_stack_fffffffffffff358;
  Integer *in_stack_fffffffffffff360;
  int in_stack_fffffffffffff368;
  int in_stack_fffffffffffff36c;
  int in_stack_fffffffffffff370;
  int in_stack_fffffffffffff374;
  int local_c88;
  int local_c84;
  int in_stack_fffffffffffff380;
  int in_stack_fffffffffffff384;
  undefined4 in_stack_fffffffffffff388;
  undefined4 in_stack_fffffffffffff38c;
  int local_c58;
  int local_c54;
  int local_c4c;
  int local_c48 [10];
  int local_c20;
  int local_c1c;
  long local_c18;
  long local_c10;
  long local_c08;
  long local_c00;
  long local_bf8;
  long local_bf0;
  long local_be8;
  long local_be0;
  long local_bd8;
  long local_bd0;
  long local_bc8;
  long local_bc0;
  long local_bb8;
  long local_bb0;
  long local_ba8 [8];
  long local_b68 [7];
  long local_b30;
  long local_b28;
  long local_b20;
  long in_stack_fffffffffffff4e8;
  int in_stack_fffffffffffff4f0;
  int in_stack_fffffffffffff4f4;
  int local_b08;
  int local_b04;
  int local_afc;
  int local_af8 [7];
  int local_adc;
  int local_ad8;
  int local_ad4;
  int local_ad0;
  int local_acc;
  int local_ac8 [2];
  Integer in_stack_fffffffffffff540;
  int local_a9c;
  long local_a90;
  long local_a80;
  long local_a78;
  long local_a70;
  long local_a58;
  long local_a48;
  long local_a40;
  long local_a38;
  long local_a28 [8];
  long local_9e8 [8];
  Integer *in_stack_fffffffffffff658;
  long lVar14;
  Integer *in_stack_fffffffffffff660;
  long in_stack_fffffffffffff668;
  long in_stack_fffffffffffff670;
  char local_988 [256];
  char *local_888;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  int local_868;
  int local_864;
  int local_860;
  int local_85c;
  int local_858 [7];
  int local_83c;
  int local_838;
  int local_834;
  int local_830;
  int local_82c;
  int local_828 [10];
  int local_800;
  int local_7fc;
  long local_7f8;
  long local_7f0;
  long local_7e8;
  long local_7e0;
  long local_7d8;
  long local_7d0;
  long local_7c8;
  long local_7c0;
  long local_7b8;
  long local_7b0;
  long local_7a8;
  long local_7a0;
  long local_798;
  long local_790;
  long local_788 [8];
  long local_748 [7];
  long local_710;
  long local_708;
  long local_700;
  long local_6f8;
  int local_6f0;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  int local_6d8 [7];
  int local_6bc;
  int local_6b8;
  int local_6b4;
  int local_6b0;
  int local_6ac;
  int local_6a8 [10];
  int local_680;
  int local_67c;
  long local_678;
  long local_670;
  long local_668;
  Integer local_660;
  long local_658;
  long local_650;
  long local_648;
  long local_640;
  long local_638;
  long local_630;
  Integer local_628;
  long local_620;
  long local_618;
  long local_610;
  long local_608 [8];
  long local_5c8 [8];
  long local_588;
  long local_580;
  long local_578;
  long local_570;
  char local_568 [168];
  Integer *in_stack_fffffffffffffb40;
  Integer *in_stack_fffffffffffffb48;
  Integer *in_stack_fffffffffffffb50;
  Integer *in_stack_fffffffffffffb58;
  Integer *in_stack_fffffffffffffb60;
  Integer in_stack_fffffffffffffb68;
  int local_460;
  int local_45c;
  int local_428 [8];
  int local_408 [8];
  int local_3e8 [8];
  long local_3c8 [8];
  long local_388 [8];
  long alStack_348 [8];
  long alStack_308 [8];
  undefined8 local_2c8 [8];
  undefined8 local_288 [8];
  long local_248 [8];
  long local_208 [8];
  Integer aIStack_1c8 [8];
  long local_188 [8];
  long local_148 [8];
  Integer local_108 [8];
  Integer local_c8 [8];
  long alStack_88 [7];
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_20;
  long local_18;
  Integer local_10;
  logical local_8;
  
  local_30 = in_RDI + 1000;
  local_10 = in_RDI;
  IVar4 = pnga_nodeid();
  lVar5 = pnga_has_ghosts(local_10);
  if (lVar5 == 0) {
    local_8 = 1;
  }
  else {
    local_40 = (long)GA[local_30].elemsize;
    local_48 = (long)GA[local_30].ndim;
    lVar6 = (long)GA[local_30].p_handle;
    pnga_distribution(in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                      in_stack_fffffffffffff658);
    for (local_18 = 0; local_18 < local_48; local_18 = local_18 + 1) {
      alStack_88[local_18] = 0;
      local_c8[local_18] = GA[local_30].width[local_18];
      local_108[local_18] = GA[local_30].dims[local_18];
      if ((local_148[local_18] == 0) && (local_188[local_18] == -1)) {
        return 0;
      }
    }
    lVar5 = gai_check_ghost_distr(local_10);
    if (lVar5 == 0) {
      local_8 = 0;
    }
    else {
      __ptr = malloc((GAnproc * 0xe + 1) * 8);
      if (__ptr == (void *)0x0) {
        pnga_error((char *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
                   in_stack_fffffffffffff4e8);
      }
      __ptr_00 = (long *)malloc(GAnproc << 3);
      if (__ptr_00 == (long *)0x0) {
        pnga_error((char *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
                   in_stack_fffffffffffff4e8);
      }
      for (local_18 = 0; local_18 < local_48; local_18 = local_18 + 1) {
        local_50 = local_c8[local_18];
        if (local_c8[local_18] != 0) {
          pIVar12 = local_108;
          slo_rem_00 = local_c8;
          get_remote_block_neg
                    (CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                     in_stack_fffffffffffff360,in_stack_fffffffffffff358,slo_rem_00,pIVar12,
                     (Integer *)CONCAT44(in_stack_fffffffffffff384,in_stack_fffffffffffff380),
                     (Integer *)CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388));
          lVar5 = pnga_locate_region(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                                     in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                                     in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
          iVar13 = (int)((ulong)pIVar12 >> 0x20);
          if (lVar5 == 0) {
            sprintf(local_568,"%s","cannot locate region: ");
            sVar7 = strlen("cannot locate region: ");
            sprintf(local_568 + (int)sVar7,"%s",GA[local_10 + 1000].name);
            sVar7 = strlen(local_568);
            sprintf(local_568 + (int)sVar7," [%ld:%ld ",local_288[0],local_2c8[0]);
            sVar7 = strlen(local_568);
            local_460 = (int)sVar7;
            local_45c = 1;
            while( true ) {
              in_stack_fffffffffffff360 = (Integer *)(long)local_45c;
              IVar8 = pnga_ndim(in_stack_fffffffffffff540);
              iVar13 = (int)((ulong)pIVar12 >> 0x20);
              if (IVar8 <= (long)in_stack_fffffffffffff360) break;
              sprintf(local_568 + local_460,",%ld:%ld ",local_288[local_45c],local_2c8[local_45c]);
              sVar7 = strlen(local_568);
              local_460 = (int)sVar7;
              local_45c = local_45c + 1;
            }
            sprintf(local_568 + local_460,"%s","]");
            strlen(local_568);
            pnga_error((char *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
                       in_stack_fffffffffffff4e8);
          }
          local_38 = *__ptr_00;
          pnga_distribution(in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                            in_stack_fffffffffffff660,in_stack_fffffffffffff658);
          for (local_20 = 0; local_20 < local_48; local_20 = local_20 + 1) {
            if (alStack_88[local_20] == 0) {
              if (local_20 == local_18) {
                alStack_308[local_20] =
                     (local_248[local_20] - local_208[local_20]) + local_c8[local_20] + 1;
                alStack_348[local_20] =
                     (local_248[local_20] - local_208[local_20]) + local_c8[local_20] * 2;
                aIStack_1c8[local_20] = local_c8[local_20];
              }
              else {
                alStack_308[local_20] = local_c8[local_20];
                alStack_348[local_20] =
                     (local_248[local_20] - local_208[local_20]) + local_c8[local_20];
                aIStack_1c8[local_20] = local_c8[local_20];
              }
            }
            else {
              alStack_308[local_20] = 0;
              alStack_348[local_20] =
                   (local_248[local_20] - local_208[local_20]) + alStack_88[local_20];
              aIStack_1c8[local_20] = 0;
            }
          }
          local_578 = 1;
          local_580 = (long)(GA[local_30].ndim + -1);
          local_588 = 0;
          local_b08 = (int)IVar4;
          if (GA[local_30].distr_type == 0) {
            if (GA[local_30].num_rstrctd == 0) {
              local_630 = (long)GA[local_30].ndim;
              local_638 = 0;
              local_618 = 1;
              for (local_620 = 0; local_620 < local_630; local_620 = local_620 + 1) {
                local_618 = GA[local_30].nblock[local_620] * local_618;
              }
              if ((local_618 + -1 < IVar4) || (IVar4 < 0)) {
                for (local_620 = 0; local_620 < local_630; local_620 = local_620 + 1) {
                  local_5c8[local_620] = 0;
                  local_608[local_620] = -1;
                }
              }
              else {
                local_628 = IVar4;
                for (local_620 = 0; local_620 < local_630; local_620 = local_620 + 1) {
                  local_610 = local_628 % (long)GA[local_30].nblock[local_620];
                  local_628 = local_628 / (long)GA[local_30].nblock[local_620];
                  local_640 = local_610 + local_638;
                  local_638 = GA[local_30].nblock[local_620] + local_638;
                  local_5c8[local_620] = GA[local_30].mapc[local_640];
                  if (local_610 == GA[local_30].nblock[local_620] + -1) {
                    local_608[local_620] = GA[local_30].dims[local_620];
                  }
                  else {
                    local_608[local_620] = GA[local_30].mapc[local_640 + 1] + -1;
                  }
                }
              }
            }
            else if (IVar4 < GA[local_30].num_rstrctd) {
              local_668 = (long)GA[local_30].ndim;
              local_670 = 0;
              local_650 = 1;
              for (local_658 = 0; local_658 < local_668; local_658 = local_658 + 1) {
                local_650 = GA[local_30].nblock[local_658] * local_650;
              }
              if ((local_650 + -1 < IVar4) || (IVar4 < 0)) {
                for (local_658 = 0; local_658 < local_668; local_658 = local_658 + 1) {
                  local_5c8[local_658] = 0;
                  local_608[local_658] = -1;
                }
              }
              else {
                local_660 = IVar4;
                for (local_658 = 0; local_658 < local_668; local_658 = local_658 + 1) {
                  local_648 = local_660 % (long)GA[local_30].nblock[local_658];
                  local_660 = local_660 / (long)GA[local_30].nblock[local_658];
                  local_678 = local_648 + local_670;
                  local_670 = GA[local_30].nblock[local_658] + local_670;
                  local_5c8[local_658] = GA[local_30].mapc[local_678];
                  if (local_648 == GA[local_30].nblock[local_658] + -1) {
                    local_608[local_658] = GA[local_30].dims[local_658];
                  }
                  else {
                    local_608[local_658] = GA[local_30].mapc[local_678 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_30].ndim;
              local_680 = (int)sVar1;
              for (local_67c = 0; local_67c < sVar1; local_67c = local_67c + 1) {
                local_5c8[local_67c] = 0;
                local_608[local_67c] = -1;
              }
            }
          }
          else if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
                  (GA[local_30].distr_type == 3)) {
            sVar1 = GA[local_30].ndim;
            local_6b0 = (int)sVar1;
            sVar2 = GA[local_30].ndim;
            local_6bc = (int)sVar2;
            local_6b4 = local_b08;
            local_6a8[0] = (int)((long)local_b08 % GA[local_30].num_blocks[0]);
            for (local_6b8 = 1; local_6b8 < sVar2; local_6b8 = local_6b8 + 1) {
              local_6b4 = (int)((long)(local_6b4 - local_6a8[local_6b8 + -1]) /
                               GA[local_30].num_blocks[local_6b8 + -1]);
              local_6a8[local_6b8] = (int)((long)local_6b4 % GA[local_30].num_blocks[local_6b8]);
            }
            for (local_6ac = 0; local_6ac < sVar1; local_6ac = local_6ac + 1) {
              local_5c8[local_6ac] =
                   (long)local_6a8[local_6ac] * GA[local_30].block_dims[local_6ac] + 1;
              local_608[local_6ac] =
                   (long)(local_6a8[local_6ac] + 1) * GA[local_30].block_dims[local_6ac];
              if (GA[local_30].dims[local_6ac] < local_608[local_6ac]) {
                local_608[local_6ac] = GA[local_30].dims[local_6ac];
              }
            }
          }
          else if (GA[local_30].distr_type == 4) {
            sVar1 = GA[local_30].ndim;
            local_6e0 = (int)sVar1;
            local_6e4 = 0;
            sVar2 = GA[local_30].ndim;
            local_6f0 = (int)sVar2;
            local_6e8 = local_b08;
            local_6d8[0] = (int)((long)local_b08 % GA[local_30].num_blocks[0]);
            for (local_6ec = 1; local_6ec < sVar2; local_6ec = local_6ec + 1) {
              local_6e8 = (int)((long)(local_6e8 - local_6d8[local_6ec + -1]) /
                               GA[local_30].num_blocks[local_6ec + -1]);
              local_6d8[local_6ec] = (int)((long)local_6e8 % GA[local_30].num_blocks[local_6ec]);
            }
            for (local_6dc = 0; local_6dc < sVar1; local_6dc = local_6dc + 1) {
              local_5c8[local_6dc] = GA[local_30].mapc[local_6e4 + local_6d8[local_6dc]];
              if ((long)local_6d8[local_6dc] < GA[local_30].num_blocks[local_6dc] + -1) {
                local_608[local_6dc] = GA[local_30].mapc[local_6e4 + local_6d8[local_6dc] + 1] + -1;
              }
              else {
                local_608[local_6dc] = GA[local_30].dims[local_6dc];
              }
              local_6e4 = local_6e4 + (int)GA[local_30].num_blocks[local_6dc];
            }
          }
          if (local_580 == 0) {
            local_388[0] = (local_608[0] - local_5c8[0]) + 1 + GA[local_30].width[0] * 2;
          }
          for (local_570 = 0; local_570 < local_580; local_570 = local_570 + 1) {
            local_588 = aIStack_1c8[local_570] * local_578 + local_588;
            local_388[local_570] =
                 (local_608[local_570] - local_5c8[local_570]) + 1 +
                 GA[local_30].width[local_570] * 2;
            local_578 = local_388[local_570] * local_578;
          }
          local_588 = aIStack_1c8[local_580] * local_578 + local_588;
          local_700 = 1;
          local_708 = (long)(GA[local_30].ndim + -1);
          local_710 = 0;
          if (GA[local_30].distr_type == 0) {
            if (GA[local_30].num_rstrctd == 0) {
              local_7b0 = (long)GA[local_30].ndim;
              local_7b8 = 0;
              local_798 = 1;
              for (local_7a0 = 0; local_7a0 < local_7b0; local_7a0 = local_7a0 + 1) {
                local_798 = GA[local_30].nblock[local_7a0] * local_798;
              }
              if ((local_798 + -1 < local_38) || (local_38 < 0)) {
                for (local_7a0 = 0; local_7a0 < local_7b0; local_7a0 = local_7a0 + 1) {
                  local_748[local_7a0] = 0;
                  local_788[local_7a0] = -1;
                }
              }
              else {
                local_7a8 = local_38;
                for (local_7a0 = 0; local_7a0 < local_7b0; local_7a0 = local_7a0 + 1) {
                  local_790 = local_7a8 % (long)GA[local_30].nblock[local_7a0];
                  local_7a8 = local_7a8 / (long)GA[local_30].nblock[local_7a0];
                  local_7c0 = local_790 + local_7b8;
                  local_7b8 = GA[local_30].nblock[local_7a0] + local_7b8;
                  local_748[local_7a0] = GA[local_30].mapc[local_7c0];
                  if (local_790 == GA[local_30].nblock[local_7a0] + -1) {
                    local_788[local_7a0] = GA[local_30].dims[local_7a0];
                  }
                  else {
                    local_788[local_7a0] = GA[local_30].mapc[local_7c0 + 1] + -1;
                  }
                }
              }
            }
            else if (local_38 < GA[local_30].num_rstrctd) {
              local_7e8 = (long)GA[local_30].ndim;
              local_7f0 = 0;
              local_7d0 = 1;
              for (local_7d8 = 0; local_7d8 < local_7e8; local_7d8 = local_7d8 + 1) {
                local_7d0 = GA[local_30].nblock[local_7d8] * local_7d0;
              }
              if ((local_7d0 + -1 < local_38) || (local_38 < 0)) {
                for (local_7d8 = 0; local_7d8 < local_7e8; local_7d8 = local_7d8 + 1) {
                  local_748[local_7d8] = 0;
                  local_788[local_7d8] = -1;
                }
              }
              else {
                local_7e0 = local_38;
                for (local_7d8 = 0; local_7d8 < local_7e8; local_7d8 = local_7d8 + 1) {
                  local_7c8 = local_7e0 % (long)GA[local_30].nblock[local_7d8];
                  local_7e0 = local_7e0 / (long)GA[local_30].nblock[local_7d8];
                  local_7f8 = local_7c8 + local_7f0;
                  local_7f0 = GA[local_30].nblock[local_7d8] + local_7f0;
                  local_748[local_7d8] = GA[local_30].mapc[local_7f8];
                  if (local_7c8 == GA[local_30].nblock[local_7d8] + -1) {
                    local_788[local_7d8] = GA[local_30].dims[local_7d8];
                  }
                  else {
                    local_788[local_7d8] = GA[local_30].mapc[local_7f8 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_30].ndim;
              local_800 = (int)sVar1;
              for (local_7fc = 0; local_7fc < sVar1; local_7fc = local_7fc + 1) {
                local_748[local_7fc] = 0;
                local_788[local_7fc] = -1;
              }
            }
          }
          else {
            iVar3 = (int)local_38;
            if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
               (GA[local_30].distr_type == 3)) {
              sVar1 = GA[local_30].ndim;
              local_830 = (int)sVar1;
              sVar2 = GA[local_30].ndim;
              local_83c = (int)sVar2;
              local_834 = iVar3;
              local_828[0] = (int)((long)iVar3 % GA[local_30].num_blocks[0]);
              for (local_838 = 1; local_838 < sVar2; local_838 = local_838 + 1) {
                local_834 = (int)((long)(local_834 - local_828[local_838 + -1]) /
                                 GA[local_30].num_blocks[local_838 + -1]);
                local_828[local_838] = (int)((long)local_834 % GA[local_30].num_blocks[local_838]);
              }
              for (local_82c = 0; local_82c < sVar1; local_82c = local_82c + 1) {
                local_748[local_82c] =
                     (long)local_828[local_82c] * GA[local_30].block_dims[local_82c] + 1;
                local_788[local_82c] =
                     (long)(local_828[local_82c] + 1) * GA[local_30].block_dims[local_82c];
                if (GA[local_30].dims[local_82c] < local_788[local_82c]) {
                  local_788[local_82c] = GA[local_30].dims[local_82c];
                }
              }
            }
            else if (GA[local_30].distr_type == 4) {
              sVar1 = GA[local_30].ndim;
              local_860 = (int)sVar1;
              local_864 = 0;
              sVar2 = GA[local_30].ndim;
              local_870 = (int)sVar2;
              local_868 = iVar3;
              local_858[0] = (int)((long)iVar3 % GA[local_30].num_blocks[0]);
              for (local_86c = 1; local_86c < sVar2; local_86c = local_86c + 1) {
                local_868 = (int)((long)(local_868 - local_858[local_86c + -1]) /
                                 GA[local_30].num_blocks[local_86c + -1]);
                local_858[local_86c] = (int)((long)local_868 % GA[local_30].num_blocks[local_86c]);
              }
              for (local_85c = 0; local_85c < sVar1; local_85c = local_85c + 1) {
                local_748[local_85c] = GA[local_30].mapc[local_864 + local_858[local_85c]];
                if ((long)local_858[local_85c] < GA[local_30].num_blocks[local_85c] + -1) {
                  local_788[local_85c] =
                       GA[local_30].mapc[local_864 + local_858[local_85c] + 1] + -1;
                }
                else {
                  local_788[local_85c] = GA[local_30].dims[local_85c];
                }
                local_864 = local_864 + (int)GA[local_30].num_blocks[local_85c];
              }
            }
          }
          if (local_708 == 0) {
            local_3c8[0] = (local_788[0] - local_748[0]) + 1 + GA[local_30].width[0] * 2;
          }
          for (local_6f8 = 0; local_6f8 < local_708; local_6f8 = local_6f8 + 1) {
            local_710 = alStack_308[local_6f8] * local_700 + local_710;
            local_3c8[local_6f8] =
                 (local_788[local_6f8] - local_748[local_6f8]) + 1 +
                 GA[local_30].width[local_6f8] * 2;
            local_700 = local_3c8[local_6f8] * local_700;
          }
          local_710 = alStack_308[local_708] * local_700 + local_710;
          local_3e8[0] = (int)local_40;
          local_408[0] = (int)local_40;
          for (local_874 = 0; (long)local_874 < local_48 + -1; local_874 = local_874 + 1) {
            local_408[local_874] = (int)local_3c8[local_874] * local_408[local_874];
            local_3e8[local_874] = (int)local_388[local_874] * local_3e8[local_874];
            local_408[local_874 + 1] = local_408[local_874];
            local_3e8[local_874 + 1] = local_3e8[local_874];
          }
          for (local_878 = 0; local_878 < local_48; local_878 = local_878 + 1) {
            local_428[local_878] = ((int)alStack_348[local_878] - (int)alStack_308[local_878]) + 1;
          }
          local_428[0] = local_428[0] * (int)local_40;
          if (-1 < lVar6) {
            local_38 = (long)PGRP_LIST[lVar6].inv_map_proc_list[local_38];
          }
          ARMCI_PutS((void *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                     (int *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                     in_stack_fffffffffffff360,(int *)in_stack_fffffffffffff358,(int *)slo_rem_00,
                     iVar13,in_stack_fffffffffffff380);
          pIVar12 = local_108;
          in_stack_fffffffffffff350 = local_c8;
          get_remote_block_pos
                    (CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                     in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350,
                     pIVar12,(Integer *)
                             CONCAT44(in_stack_fffffffffffff384,in_stack_fffffffffffff380),
                     (Integer *)CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388));
          lVar5 = pnga_locate_region(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                                     in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                                     in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
          iVar13 = (int)((ulong)pIVar12 >> 0x20);
          if (lVar5 == 0) {
            local_888 = "cannot locate region: ";
            sprintf(local_988,"%s","cannot locate region: ");
            local_87c = 0;
            sVar7 = strlen(local_888);
            local_880 = (int)sVar7;
            sprintf(local_988 + local_880,"%s",GA[local_10 + 1000].name);
            sVar7 = strlen(local_988);
            local_880 = (int)sVar7;
            sprintf(local_988 + (int)sVar7," [%ld:%ld ",local_288[local_87c],local_2c8[local_87c]);
            sVar7 = strlen(local_988);
            local_880 = (int)sVar7;
            local_87c = 1;
            while( true ) {
              in_stack_fffffffffffff358 = (Integer *)(long)local_87c;
              IVar8 = pnga_ndim(in_stack_fffffffffffff540);
              iVar13 = (int)((ulong)pIVar12 >> 0x20);
              if (IVar8 <= (long)in_stack_fffffffffffff358) break;
              sprintf(local_988 + local_880,",%ld:%ld ",local_288[local_87c],local_2c8[local_87c]);
              sVar7 = strlen(local_988);
              local_880 = (int)sVar7;
              local_87c = local_87c + 1;
            }
            sprintf(local_988 + local_880,"%s","]");
            sVar7 = strlen(local_988);
            local_880 = (int)sVar7;
            pnga_error((char *)CONCAT44(in_stack_fffffffffffff4f4,in_stack_fffffffffffff4f0),
                       in_stack_fffffffffffff4e8);
          }
          local_38 = *__ptr_00;
          pnga_distribution(in_stack_fffffffffffff670,in_stack_fffffffffffff668,
                            in_stack_fffffffffffff660,in_stack_fffffffffffff658);
          for (local_20 = 0; local_20 < local_48; local_20 = local_20 + 1) {
            if (alStack_88[local_20] == 0) {
              if (local_20 == local_18) {
                alStack_308[local_20] = 0;
                alStack_348[local_20] = local_c8[local_20] + -1;
                aIStack_1c8[local_20] =
                     (local_188[local_20] - local_148[local_20]) + local_c8[local_20] + -1;
              }
              else {
                alStack_308[local_20] = local_c8[local_20];
                alStack_348[local_20] =
                     (local_248[local_20] - local_208[local_20]) + local_c8[local_20];
                aIStack_1c8[local_20] = local_c8[local_20];
              }
            }
            else {
              alStack_308[local_20] = 0;
              alStack_348[local_20] =
                   (local_248[local_20] - local_208[local_20]) + alStack_88[local_20];
              aIStack_1c8[local_20] = 0;
            }
          }
          in_stack_fffffffffffff668 = 1;
          in_stack_fffffffffffff660 = (Integer *)(long)(GA[local_30].ndim + -1);
          lVar14 = 0;
          if (GA[local_30].distr_type == 0) {
            if (GA[local_30].num_rstrctd == 0) {
              lVar9 = (long)GA[local_30].ndim;
              local_a58 = 0;
              local_a38 = 1;
              for (local_a40 = 0; local_a40 < lVar9; local_a40 = local_a40 + 1) {
                local_a38 = GA[local_30].nblock[local_a40] * local_a38;
              }
              if ((local_a38 + -1 < IVar4) || (IVar4 < 0)) {
                for (local_a40 = 0; local_a40 < lVar9; local_a40 = local_a40 + 1) {
                  local_9e8[local_a40] = 0;
                  local_a28[local_a40] = -1;
                }
              }
              else {
                local_a48 = IVar4;
                for (local_a40 = 0; local_a40 < lVar9; local_a40 = local_a40 + 1) {
                  lVar11 = local_a48 % (long)GA[local_30].nblock[local_a40];
                  local_a48 = local_a48 / (long)GA[local_30].nblock[local_a40];
                  lVar10 = lVar11 + local_a58;
                  local_a58 = GA[local_30].nblock[local_a40] + local_a58;
                  local_9e8[local_a40] = GA[local_30].mapc[lVar10];
                  if (lVar11 == GA[local_30].nblock[local_a40] + -1) {
                    local_a28[local_a40] = GA[local_30].dims[local_a40];
                  }
                  else {
                    local_a28[local_a40] = GA[local_30].mapc[lVar10 + 1] + -1;
                  }
                }
              }
            }
            else if (IVar4 < GA[local_30].num_rstrctd) {
              lVar9 = (long)GA[local_30].ndim;
              local_a90 = 0;
              local_a70 = 1;
              for (local_a78 = 0; local_a78 < lVar9; local_a78 = local_a78 + 1) {
                local_a70 = GA[local_30].nblock[local_a78] * local_a70;
              }
              if ((local_a70 + -1 < IVar4) || (IVar4 < 0)) {
                for (local_a78 = 0; local_a78 < lVar9; local_a78 = local_a78 + 1) {
                  local_9e8[local_a78] = 0;
                  local_a28[local_a78] = -1;
                }
              }
              else {
                local_a80 = IVar4;
                for (local_a78 = 0; local_a78 < lVar9; local_a78 = local_a78 + 1) {
                  lVar11 = local_a80 % (long)GA[local_30].nblock[local_a78];
                  local_a80 = local_a80 / (long)GA[local_30].nblock[local_a78];
                  lVar10 = lVar11 + local_a90;
                  local_a90 = GA[local_30].nblock[local_a78] + local_a90;
                  local_9e8[local_a78] = GA[local_30].mapc[lVar10];
                  if (lVar11 == GA[local_30].nblock[local_a78] + -1) {
                    local_a28[local_a78] = GA[local_30].dims[local_a78];
                  }
                  else {
                    local_a28[local_a78] = GA[local_30].mapc[lVar10 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_30].ndim;
              for (local_a9c = 0; local_a9c < sVar1; local_a9c = local_a9c + 1) {
                local_9e8[local_a9c] = 0;
                local_a28[local_a9c] = -1;
              }
            }
          }
          else if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
                  (GA[local_30].distr_type == 3)) {
            sVar1 = GA[local_30].ndim;
            local_ad0 = (int)sVar1;
            sVar2 = GA[local_30].ndim;
            local_adc = (int)sVar2;
            local_ad4 = local_b08;
            local_ac8[0] = (int)((long)local_b08 % GA[local_30].num_blocks[0]);
            for (local_ad8 = 1; local_ad8 < sVar2; local_ad8 = local_ad8 + 1) {
              local_ad4 = (int)((long)(local_ad4 - local_ac8[local_ad8 + -1]) /
                               GA[local_30].num_blocks[local_ad8 + -1]);
              local_ac8[local_ad8] = (int)((long)local_ad4 % GA[local_30].num_blocks[local_ad8]);
            }
            for (local_acc = 0; local_acc < sVar1; local_acc = local_acc + 1) {
              local_9e8[local_acc] =
                   (long)local_ac8[local_acc] * GA[local_30].block_dims[local_acc] + 1;
              local_a28[local_acc] =
                   (long)(local_ac8[local_acc] + 1) * GA[local_30].block_dims[local_acc];
              if (GA[local_30].dims[local_acc] < local_a28[local_acc]) {
                local_a28[local_acc] = GA[local_30].dims[local_acc];
              }
            }
          }
          else if (GA[local_30].distr_type == 4) {
            sVar1 = GA[local_30].ndim;
            local_b04 = 0;
            in_stack_fffffffffffff4f0 = (int)GA[local_30].ndim;
            local_af8[0] = (int)((long)local_b08 % GA[local_30].num_blocks[0]);
            for (in_stack_fffffffffffff4f4 = 1;
                in_stack_fffffffffffff4f4 < in_stack_fffffffffffff4f0;
                in_stack_fffffffffffff4f4 = in_stack_fffffffffffff4f4 + 1) {
              local_b08 = (int)((long)(local_b08 - local_af8[in_stack_fffffffffffff4f4 + -1]) /
                               GA[local_30].num_blocks[in_stack_fffffffffffff4f4 + -1]);
              local_af8[in_stack_fffffffffffff4f4] =
                   (int)((long)local_b08 % GA[local_30].num_blocks[in_stack_fffffffffffff4f4]);
            }
            for (local_afc = 0; local_afc < sVar1; local_afc = local_afc + 1) {
              local_9e8[local_afc] = GA[local_30].mapc[local_b04 + local_af8[local_afc]];
              if ((long)local_af8[local_afc] < GA[local_30].num_blocks[local_afc] + -1) {
                local_a28[local_afc] = GA[local_30].mapc[local_b04 + local_af8[local_afc] + 1] + -1;
              }
              else {
                local_a28[local_afc] = GA[local_30].dims[local_afc];
              }
              local_b04 = local_b04 + (int)GA[local_30].num_blocks[local_afc];
            }
          }
          if (in_stack_fffffffffffff660 == (Integer *)0x0) {
            local_388[0] = (local_a28[0] - local_9e8[0]) + 1 + GA[local_30].width[0] * 2;
          }
          for (in_stack_fffffffffffff670 = 0;
              in_stack_fffffffffffff670 < (long)in_stack_fffffffffffff660;
              in_stack_fffffffffffff670 = in_stack_fffffffffffff670 + 1) {
            lVar14 = aIStack_1c8[in_stack_fffffffffffff670] * in_stack_fffffffffffff668 + lVar14;
            local_388[in_stack_fffffffffffff670] =
                 (local_a28[in_stack_fffffffffffff670] - local_9e8[in_stack_fffffffffffff670]) + 1 +
                 GA[local_30].width[in_stack_fffffffffffff670] * 2;
            in_stack_fffffffffffff668 =
                 local_388[in_stack_fffffffffffff670] * in_stack_fffffffffffff668;
          }
          in_stack_fffffffffffff658 =
               (Integer *)
               (aIStack_1c8[(long)in_stack_fffffffffffff660] * in_stack_fffffffffffff668 + lVar14);
          local_b20 = 1;
          local_b28 = (long)(GA[local_30].ndim + -1);
          local_b30 = 0;
          if (GA[local_30].distr_type == 0) {
            if (GA[local_30].num_rstrctd == 0) {
              local_bd0 = (long)GA[local_30].ndim;
              local_bd8 = 0;
              local_bb8 = 1;
              for (local_bc0 = 0; local_bc0 < local_bd0; local_bc0 = local_bc0 + 1) {
                local_bb8 = GA[local_30].nblock[local_bc0] * local_bb8;
              }
              if ((local_bb8 + -1 < local_38) || (local_38 < 0)) {
                for (local_bc0 = 0; local_bc0 < local_bd0; local_bc0 = local_bc0 + 1) {
                  local_b68[local_bc0] = 0;
                  local_ba8[local_bc0] = -1;
                }
              }
              else {
                local_bc8 = local_38;
                for (local_bc0 = 0; local_bc0 < local_bd0; local_bc0 = local_bc0 + 1) {
                  local_bb0 = local_bc8 % (long)GA[local_30].nblock[local_bc0];
                  local_bc8 = local_bc8 / (long)GA[local_30].nblock[local_bc0];
                  local_be0 = local_bb0 + local_bd8;
                  local_bd8 = GA[local_30].nblock[local_bc0] + local_bd8;
                  local_b68[local_bc0] = GA[local_30].mapc[local_be0];
                  if (local_bb0 == GA[local_30].nblock[local_bc0] + -1) {
                    local_ba8[local_bc0] = GA[local_30].dims[local_bc0];
                  }
                  else {
                    local_ba8[local_bc0] = GA[local_30].mapc[local_be0 + 1] + -1;
                  }
                }
              }
            }
            else if (local_38 < GA[local_30].num_rstrctd) {
              local_c08 = (long)GA[local_30].ndim;
              local_c10 = 0;
              local_bf0 = 1;
              for (local_bf8 = 0; local_bf8 < local_c08; local_bf8 = local_bf8 + 1) {
                local_bf0 = GA[local_30].nblock[local_bf8] * local_bf0;
              }
              if ((local_bf0 + -1 < local_38) || (local_38 < 0)) {
                for (local_bf8 = 0; local_bf8 < local_c08; local_bf8 = local_bf8 + 1) {
                  local_b68[local_bf8] = 0;
                  local_ba8[local_bf8] = -1;
                }
              }
              else {
                local_c00 = local_38;
                for (local_bf8 = 0; local_bf8 < local_c08; local_bf8 = local_bf8 + 1) {
                  local_be8 = local_c00 % (long)GA[local_30].nblock[local_bf8];
                  local_c00 = local_c00 / (long)GA[local_30].nblock[local_bf8];
                  local_c18 = local_be8 + local_c10;
                  local_c10 = GA[local_30].nblock[local_bf8] + local_c10;
                  local_b68[local_bf8] = GA[local_30].mapc[local_c18];
                  if (local_be8 == GA[local_30].nblock[local_bf8] + -1) {
                    local_ba8[local_bf8] = GA[local_30].dims[local_bf8];
                  }
                  else {
                    local_ba8[local_bf8] = GA[local_30].mapc[local_c18 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_30].ndim;
              local_c20 = (int)sVar1;
              for (local_c1c = 0; local_c1c < sVar1; local_c1c = local_c1c + 1) {
                local_b68[local_c1c] = 0;
                local_ba8[local_c1c] = -1;
              }
            }
          }
          else {
            local_c88 = (int)local_38;
            if (((GA[local_30].distr_type == 1) || (GA[local_30].distr_type == 2)) ||
               (GA[local_30].distr_type == 3)) {
              sVar1 = GA[local_30].ndim;
              sVar2 = GA[local_30].ndim;
              local_c48[0] = (int)((long)local_c88 % GA[local_30].num_blocks[0]);
              local_c54 = local_c88;
              for (local_c58 = 1; local_c58 < sVar2; local_c58 = local_c58 + 1) {
                local_c54 = (int)((long)(local_c54 - local_c48[local_c58 + -1]) /
                                 GA[local_30].num_blocks[local_c58 + -1]);
                local_c48[local_c58] = (int)((long)local_c54 % GA[local_30].num_blocks[local_c58]);
              }
              for (local_c4c = 0; local_c4c < sVar1; local_c4c = local_c4c + 1) {
                local_b68[local_c4c] =
                     (long)local_c48[local_c4c] * GA[local_30].block_dims[local_c4c] + 1;
                local_ba8[local_c4c] =
                     (long)(local_c48[local_c4c] + 1) * GA[local_30].block_dims[local_c4c];
                if (GA[local_30].dims[local_c4c] < local_ba8[local_c4c]) {
                  local_ba8[local_c4c] = GA[local_30].dims[local_c4c];
                }
              }
            }
            else if (GA[local_30].distr_type == 4) {
              in_stack_fffffffffffff380 = (int)GA[local_30].ndim;
              local_c84 = 0;
              in_stack_fffffffffffff370 = (int)GA[local_30].ndim;
              in_stack_fffffffffffff388 = (undefined4)((long)local_c88 % GA[local_30].num_blocks[0])
              ;
              for (in_stack_fffffffffffff374 = 1;
                  in_stack_fffffffffffff374 < in_stack_fffffffffffff370;
                  in_stack_fffffffffffff374 = in_stack_fffffffffffff374 + 1) {
                local_c88 = (int)((long)(local_c88 -
                                        *(int *)(&stack0xfffffffffffff388 +
                                                (long)(in_stack_fffffffffffff374 + -1) * 4)) /
                                 GA[local_30].num_blocks[in_stack_fffffffffffff374 + -1]);
                *(int *)(&stack0xfffffffffffff388 + (long)in_stack_fffffffffffff374 * 4) =
                     (int)((long)local_c88 % GA[local_30].num_blocks[in_stack_fffffffffffff374]);
              }
              for (in_stack_fffffffffffff384 = 0;
                  in_stack_fffffffffffff384 < in_stack_fffffffffffff380;
                  in_stack_fffffffffffff384 = in_stack_fffffffffffff384 + 1) {
                local_b68[in_stack_fffffffffffff384] =
                     GA[local_30].mapc
                     [local_c84 +
                      *(int *)(&stack0xfffffffffffff388 + (long)in_stack_fffffffffffff384 * 4)];
                if ((long)*(int *)(&stack0xfffffffffffff388 + (long)in_stack_fffffffffffff384 * 4) <
                    GA[local_30].num_blocks[in_stack_fffffffffffff384] + -1) {
                  local_ba8[in_stack_fffffffffffff384] =
                       GA[local_30].mapc
                       [local_c84 +
                        *(int *)(&stack0xfffffffffffff388 + (long)in_stack_fffffffffffff384 * 4) + 1
                       ] + -1;
                }
                else {
                  local_ba8[in_stack_fffffffffffff384] =
                       GA[local_30].dims[in_stack_fffffffffffff384];
                }
                local_c84 = local_c84 + (int)GA[local_30].num_blocks[in_stack_fffffffffffff384];
              }
            }
          }
          if (local_b28 == 0) {
            local_3c8[0] = (local_ba8[0] - local_b68[0]) + 1 + GA[local_30].width[0] * 2;
          }
          for (in_stack_fffffffffffff4e8 = 0; in_stack_fffffffffffff4e8 < local_b28;
              in_stack_fffffffffffff4e8 = in_stack_fffffffffffff4e8 + 1) {
            local_b30 = alStack_308[in_stack_fffffffffffff4e8] * local_b20 + local_b30;
            local_3c8[in_stack_fffffffffffff4e8] =
                 (local_ba8[in_stack_fffffffffffff4e8] - local_b68[in_stack_fffffffffffff4e8]) + 1 +
                 GA[local_30].width[in_stack_fffffffffffff4e8] * 2;
            local_b20 = local_3c8[in_stack_fffffffffffff4e8] * local_b20;
          }
          local_b30 = alStack_308[local_b28] * local_b20 + local_b30;
          local_3e8[0] = (int)local_40;
          local_408[0] = (int)local_40;
          for (in_stack_fffffffffffff36c = 0; (long)in_stack_fffffffffffff36c < local_48 + -1;
              in_stack_fffffffffffff36c = in_stack_fffffffffffff36c + 1) {
            local_408[in_stack_fffffffffffff36c] =
                 (int)local_3c8[in_stack_fffffffffffff36c] * local_408[in_stack_fffffffffffff36c];
            local_3e8[in_stack_fffffffffffff36c] =
                 (int)local_388[in_stack_fffffffffffff36c] * local_3e8[in_stack_fffffffffffff36c];
            local_408[in_stack_fffffffffffff36c + 1] = local_408[in_stack_fffffffffffff36c];
            local_3e8[in_stack_fffffffffffff36c + 1] = local_3e8[in_stack_fffffffffffff36c];
          }
          for (in_stack_fffffffffffff368 = 0; in_stack_fffffffffffff368 < local_48;
              in_stack_fffffffffffff368 = in_stack_fffffffffffff368 + 1) {
            local_428[in_stack_fffffffffffff368] =
                 ((int)alStack_348[in_stack_fffffffffffff368] -
                 (int)alStack_308[in_stack_fffffffffffff368]) + 1;
          }
          local_428[0] = local_428[0] * (int)local_40;
          if (-1 < lVar6) {
            local_38 = (long)PGRP_LIST[lVar6].inv_map_proc_list[local_38];
          }
          ARMCI_PutS((void *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                     (int *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                     in_stack_fffffffffffff360,(int *)in_stack_fffffffffffff358,
                     (int *)in_stack_fffffffffffff350,iVar13,in_stack_fffffffffffff380);
        }
        if (local_18 < local_48 + -1) {
          pnga_pgroup_sync((Integer)in_stack_fffffffffffff350);
        }
        alStack_88[local_18] = local_50 << 1;
      }
      free(__ptr);
      free(__ptr_00);
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

logical pnga_update3_ghosts(Integer g_a)
{
  Integer idx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension. This implementation uses simple put
   * operations to perform the updates along each dimension with an
   * intervening synchronization call being used to make sure that the
   * necessary data is available on each processor before starting the
   * update along the next dimension.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) return FALSE;
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update3_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update3_ghosts:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {
    nwidth = width[idx];

    /* Do not bother with update if nwidth is zero */
    if (nwidth != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired location of remote
         data as well as the actual coordinates of the local chunk
         of data that will be sent to remote processor (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem);

      /* Perform update in positive direction */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired chunk of remote
         data as well as the actual coordinates of the local chunk
         of data that will receive the remote data (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = 0;
            phi_rem[i] = width[i] - 1;
            plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* get remote data */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem);
    }
    /* synchronize all processors and update increment array */
    if (idx < ndim-1) pnga_pgroup_sync(p_handle);
    increment[idx] = 2*nwidth;
  }
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}